

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

Material * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::Material>
          (Structure *this,shared_ptr<Assimp::Blender::Material> *out,size_t *s)

{
  Material *__p;
  __shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  __p = (Material *)operator_new(0x6b8);
  memset(__p,0,0x5a0);
  (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Material_0071fe60;
  (__p->id).super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_0071fdf0;
  (__p->group).super___shared_ptr<Assimp::Blender::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->group).super___shared_ptr<Assimp::Blender::Group,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  memset(__p->mtex,0,0x120);
  ::std::__shared_ptr<Assimp::Blender::Material,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::Blender::Material,void>
            ((__shared_ptr<Assimp::Blender::Material,(__gnu_cxx::_Lock_policy)2> *)&local_30,__p);
  ::std::__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&out->super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>,
             &local_30);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  *s = 1;
  return (out->super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }